

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bjoinblk(bstrList *bl,void *blk,int len)

{
  uint uVar1;
  bstring *pptVar2;
  bstring ptVar3;
  uchar *puVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  
  if (bl != (bstrList *)0x0) {
    uVar1 = bl->qty;
    uVar9 = (ulong)uVar1;
    if ((-1 < (int)(uVar1 | len)) && (blk != (void *)0x0 || len == 0)) {
      if (uVar9 == 0) {
        ptVar3 = blk2bstr(anon_var_dwarf_350e4 + 0x10,0);
        return ptVar3;
      }
      if ((int)uVar1 < 1) {
        uVar10 = 1;
      }
      else {
        uVar10 = 1;
        uVar5 = 0;
        do {
          iVar8 = bl->entry[uVar5]->slen;
          if (iVar8 < 0) {
            return (bstring)0x0;
          }
          if ((int)(uVar10 ^ 0x7fffffff) < iVar8) {
            return (bstring)0x0;
          }
          uVar10 = uVar10 + iVar8;
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
      }
      ptVar3 = (bstring)malloc(0x10);
      if (len == 0) {
        puVar4 = (uchar *)malloc((ulong)uVar10);
        ptVar3->data = puVar4;
        if (puVar4 != (uchar *)0x0) {
          if (0 < (int)uVar1) {
            pptVar2 = bl->entry;
            uVar5 = 0;
            do {
              sVar6 = (size_t)pptVar2[uVar5]->slen;
              memcpy(puVar4,pptVar2[uVar5]->data,sVar6);
              puVar4 = puVar4 + sVar6;
              uVar5 = uVar5 + 1;
            } while (uVar9 != uVar5);
          }
LAB_00151e40:
          ptVar3->mlen = uVar10;
          ptVar3->slen = uVar10 - 1;
          ptVar3->data[(long)(int)uVar10 + -1] = '\0';
          return ptVar3;
        }
      }
      else {
        iVar8 = (uVar1 - 1) * len;
        if (iVar8 <= (int)(uVar10 ^ 0x7fffffff)) {
          uVar10 = uVar10 + iVar8;
          puVar4 = (uchar *)malloc((long)(int)uVar10);
          ptVar3->data = puVar4;
          if (puVar4 != (uchar *)0x0) {
            sVar6 = (size_t)(*bl->entry)->slen;
            memcpy(puVar4,(*bl->entry)->data,sVar6);
            if (1 < bl->qty) {
              puVar4 = puVar4 + sVar6;
              lVar7 = 1;
              do {
                memcpy(puVar4,blk,(ulong)(uint)len);
                puVar4 = puVar4 + (uint)len;
                sVar6 = (size_t)bl->entry[lVar7]->slen;
                if (sVar6 != 0) {
                  memcpy(puVar4,bl->entry[lVar7]->data,sVar6);
                  puVar4 = puVar4 + sVar6;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < bl->qty);
            }
            goto LAB_00151e40;
          }
        }
      }
      free(ptVar3);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoinblk (const struct bstrList * bl, const void * blk, int len) {
bstring b;
unsigned char * p;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (len < 0) return NULL;
	if (len > 0 && blk == NULL) return NULL;
	if (bl->qty < 1) return bfromStatic ("");

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		if (v > INT_MAX - c) return NULL;	/* Overflow */
		c += v;
	}

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (len == 0) {
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		for (i = 0; i < bl->qty; i++) {
			v = bl->entry[i]->slen;
			bstr__memcpy (p, bl->entry[i]->data, v);
			p += v;
		}
	} else {
		v = (bl->qty - 1) * len;
		if ((bl->qty > 512 || len > 127) &&
			v / len != bl->qty - 1) {
			bstr__free (b);
			return NULL; /* Overflow */
		}
		if (v > INT_MAX - c) {
			bstr__free (b);
			return NULL;    /* Overflow */
		}
		c += v;
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		v = bl->entry[0]->slen;
		bstr__memcpy (p, bl->entry[0]->data, v);
		p += v;
		for (i = 1; i < bl->qty; i++) {
			bstr__memcpy (p, blk, len);
			p += len;
			v = bl->entry[i]->slen;
			if (v) {
				bstr__memcpy (p, bl->entry[i]->data, v);
				p += v;
			}
		}
	}
	b->mlen = c;
	b->slen = c-1;
	b->data[c-1] = (unsigned char) '\0';
	return b;
}